

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
::unget(lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
        *this)

{
  int iVar1;
  bool bVar2;
  int_type_conflict iVar3;
  long in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  *(undefined1 *)(in_RDI + 0x18) = 1;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
  if (*(long *)(in_RDI + 0x28) == 0) {
    if (*(long *)(in_RDI + 0x30) != 0) {
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
    }
  }
  else {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + -1;
  }
  iVar1 = *(int *)(in_RDI + 0x14);
  iVar3 = std::char_traits<char>::eof();
  if (iVar1 != iVar3) {
    bVar2 = std::vector<char,_std::allocator<char>_>::empty(unaff_retaddr);
    if (bVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,0x2240,"GGML_ASSERT(%s) failed","!token_string.empty()");
    }
    std::vector<char,_std::allocator<char>_>::pop_back
              ((vector<char,_std::allocator<char>_> *)0x2cb523);
  }
  return;
}

Assistant:

void unget()
    {
        next_unget = true;

        --position.chars_read_total;

        // in case we "unget" a newline, we have to also decrement the lines_read
        if (position.chars_read_current_line == 0)
        {
            if (position.lines_read > 0)
            {
                --position.lines_read;
            }
        }
        else
        {
            --position.chars_read_current_line;
        }

        if (JSON_HEDLEY_LIKELY(current != char_traits<char_type>::eof()))
        {
            JSON_ASSERT(!token_string.empty());
            token_string.pop_back();
        }
    }